

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

wchar_t prt_health_aux(wchar_t row,wchar_t col)

{
  monster *mon;
  byte bVar1;
  _Bool _Var2;
  uint uVar3;
  char *s;
  wchar_t n;
  wchar_t wVar4;
  
  bVar1 = monster_health_attr();
  mon = player->upkeep->health_who;
  if (mon == (monster *)0x0) {
    Term_erase(col,row,L'\f');
    wVar4 = L'\0';
  }
  else {
    _Var2 = monster_is_visible(mon);
    if (((_Var2) && (player->timed[6] == 0)) && (-1 < mon->hp)) {
      uVar3 = (mon->hp * 100) / (int)mon->maxhp;
      n = L'\x01';
      if ((9 < (int)uVar3) && (n = L'\n', uVar3 < 0x5a)) {
        n = (wchar_t)(byte)((char)((uVar3 & 0xff) / 10) + 1);
      }
      Term_putstr(col,row,L'\f',L'\x01',"[----------]");
      col = col + L'\x01';
      s = "**********";
    }
    else {
      s = "[----------]";
      n = L'\f';
    }
    wVar4 = L'\f';
    Term_putstr(col,row,n,(uint)bVar1,s);
  }
  return wVar4;
}

Assistant:

static int prt_health_aux(int row, int col)
{
	uint8_t attr = monster_health_attr();
	struct monster *mon = player->upkeep->health_who;

	/* Not tracking */
	if (!mon) {
		/* Erase the health bar */
		Term_erase(col, row, 12);
		return 0;
	}

	/* Tracking an unseen, hallucinatory, or dead monster */
	if (!monster_is_visible(mon) || /* Unseen */
		(player->timed[TMD_IMAGE]) || /* Hallucination */
		(mon->hp < 0)) { /* Dead (?) */
		/* The monster health is "unknown" */
		Term_putstr(col, row, 12, attr, "[----------]");
	} else { /* Visible */
		/* Extract the "percent" of health */
		int pct = 100L * mon->hp / mon->maxhp;

		/* Convert percent into "health" */
		int len = (pct < 10) ? 1 : (pct < 90) ? (pct / 10 + 1) : 10;

		/* Default to "unknown" */
		Term_putstr(col, row, 12, COLOUR_WHITE, "[----------]");

		/* Dump the current "health" (use '*' symbols) */
		Term_putstr(col + 1, row, len, attr, "**********");
	}

	return 12;
}